

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O0

void __thiscall flow::lang::Lexer::~Lexer(Lexer *this)

{
  Lexer *this_local;
  
  std::__cxx11::string::~string((string *)&this->stringValue_);
  SourceLocation::~SourceLocation(&this->location_);
  SourceLocation::~SourceLocation(&this->lastLocation_);
  std::__cxx11::
  list<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
  ::~list(&this->contexts_);
  return;
}

Assistant:

~Lexer() = default;